

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

uintmax_t ghc::filesystem::remove_all(path *p)

{
  uintmax_t uVar1;
  filesystem_error *this;
  error_code ec_00;
  error_code ec;
  error_code local_48;
  string local_38;
  
  local_48._M_value = 0;
  local_48._M_cat = (error_category *)std::_V2::system_category();
  uVar1 = remove_all(p,&local_48);
  if (local_48._M_value == 0) {
    return uVar1;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&local_38,local_48._M_value);
  ec_00._4_4_ = 0;
  ec_00._M_value = local_48._M_value;
  ec_00._M_cat = local_48._M_cat;
  filesystem_error::filesystem_error(this,&local_38,p,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE uintmax_t remove_all(const path& p)
{
    std::error_code ec;
    auto result = remove_all(p, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}